

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

void copy_header_external
               (Curl_easy *data,Curl_header_store *hs,size_t index,size_t amount,
               Curl_llist_element *e,curl_header **hout)

{
  curl_header *pcVar1;
  curl_header *h;
  curl_header **hout_local;
  Curl_llist_element *e_local;
  size_t amount_local;
  size_t index_local;
  Curl_header_store *hs_local;
  Curl_easy *data_local;
  
  pcVar1 = &(data->state).headerout;
  *hout = pcVar1;
  pcVar1->name = hs->name;
  (data->state).headerout.value = hs->value;
  (data->state).headerout.amount = amount;
  (data->state).headerout.index = index;
  (data->state).headerout.origin = hs->type | 0x8000000;
  (data->state).headerout.anchor = e;
  return;
}

Assistant:

static void copy_header_external(struct Curl_easy *data,
                                 struct Curl_header_store *hs,
                                 size_t index,
                                 size_t amount,
                                 struct Curl_llist_element *e,
                                 struct curl_header **hout)
{
  struct curl_header *h = *hout = &data->state.headerout;
  h->name = hs->name;
  h->value = hs->value;
  h->amount = amount;
  h->index = index;
  /* this will randomly OR a reserved bit for the sole purpose of making it
     impossible for applications to do == comparisons, as that would otherwise
     be very tempting and then lead to the reserved bits not being reserved
     anymore. */
  h->origin = hs->type | (1<<27);
  h->anchor = e;
}